

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::TransferMode&,kj::TransferMode>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::TransferMode_&,_kj::TransferMode> *params)

{
  char *pcVar1;
  size_t sVar2;
  String argValues [1];
  char **ppcVar3;
  undefined8 uVar4;
  char *local_98;
  size_t sStack_90;
  ArrayDisposer *pAStack_88;
  char *local_80;
  char **local_78;
  undefined8 uStack_70;
  StringPtr local_68;
  char *local_58;
  undefined8 local_50;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_58 = "(can\'t stringify)";
  local_50 = 0x12;
  local_68.content.ptr = "(can\'t stringify)";
  local_68.content.size_ = 0x12;
  local_80 = macroArgs;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_48,(_ *)&local_58,&params->op,&local_68,(StringPtr *)condition);
  ppcVar3 = &local_98;
  local_98 = local_48.content.ptr;
  sStack_90 = local_48.content.size_;
  pAStack_88 = local_48.content.disposer;
  uStack_70 = 1;
  uVar4 = 1;
  local_78 = ppcVar3;
  init(this,(EVP_PKEY_CTX *)file);
  sVar2 = sStack_90;
  pcVar1 = local_98;
  if (local_98 != (char *)0x0) {
    local_98 = (char *)0x0;
    sStack_90 = 0;
    (**pAStack_88->_vptr_ArrayDisposer)(pAStack_88,pcVar1,1,sVar2,sVar2,0,ppcVar3,uVar4);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}